

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

char * get_param_name(c2m_ctx_t c2m_ctx,type *param_type,char *name)

{
  MIR_type_t MVar1;
  char *pcVar2;
  MIR_type_t MVar3;
  MIR_type_t promoted_type;
  
  if ((param_type->mode & ~TM_BASIC) == TM_STRUCT) {
    MVar1 = MIR_T_I64;
  }
  else {
    MVar1 = get_mir_type(c2m_ctx,param_type);
  }
  MVar3 = MIR_T_U32;
  if ((MVar1 & 0x1d) != MIR_T_U8) {
    MVar3 = MVar1;
  }
  promoted_type = MIR_T_I32;
  if ((MVar1 & 0x1d) != MIR_T_I8) {
    promoted_type = MVar3;
  }
  pcVar2 = get_reg_var_name(c2m_ctx,promoted_type,name,0);
  return pcVar2;
}

Assistant:

static const char *get_param_name (c2m_ctx_t c2m_ctx, struct type *param_type, const char *name) {
  MIR_type_t type = (param_type->mode == TM_STRUCT || param_type->mode == TM_UNION
                       ? MIR_POINTER_TYPE
                       : get_mir_type (c2m_ctx, param_type));
  return get_reg_var_name (c2m_ctx, promote_mir_int_type (type), name, 0);
}